

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::EndEmitFunction(ByteCodeGenerator *this,ParseNodeFnc *pnodeFnc)

{
  FuncInfo *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Scope *pSVar4;
  Scope *pSVar5;
  FuncInfo *pFVar6;
  Scope *scope;
  Scope *paramScope;
  FuncInfo *funcInfo;
  ParseNodeFnc *pnodeFnc_local;
  ByteCodeGenerator *this_local;
  
  if (((pnodeFnc->super_ParseNode).nop != knopFncDecl) &&
     ((pnodeFnc->super_ParseNode).nop != knopProg)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xf82,"(pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg)",
                       "pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((((pnodeFnc->super_ParseNode).nop != knopFncDecl) ||
      (pSVar4 = Scope::GetEnclosingScope(this->currentScope), pSVar4 == (Scope *)0x0)) &&
     ((pnodeFnc->super_ParseNode).nop != knopProg)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xf83,
                       "(pnodeFnc->nop == knopFncDecl && currentScope->GetEnclosingScope() != nullptr || pnodeFnc->nop == knopProg)"
                       ,
                       "pnodeFnc->nop == knopFncDecl && currentScope->GetEnclosingScope() != nullptr || pnodeFnc->nop == knopProg"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  PopScope(this);
  this_00 = pnodeFnc->funcInfo;
  pSVar4 = this_00->paramScope;
  bVar2 = FuncInfo::IsBodyAndParamScopeMerged(this_00);
  if (!bVar2) {
    pSVar5 = GetCurrentScope(this);
    if (pSVar5 != pSVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xf8c,"(this->GetCurrentScope() == paramScope)",
                         "this->GetCurrentScope() == paramScope");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    PopScope(this);
  }
  bVar2 = Js::ParseableFunctionInfo::IsFunctionParsed(this_00->byteCodeFunction);
  if (((bVar2) && (this_00->root->pnodeBody != (ParseNodePtr)0x0)) &&
     ((pSVar4 = this_00->funcExprScope, pSVar4 != (Scope *)0x0 &&
      (bVar2 = Scope::GetMustInstantiate(pSVar4), bVar2)))) {
    if (this->currentScope != pSVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xf97,"(currentScope == scope)","currentScope == scope");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    PopScope(this);
  }
  pFVar6 = TopFuncInfo(this);
  if (this_00 != pFVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xf9c,"(funcInfo == this->TopFuncInfo())","funcInfo == this->TopFuncInfo()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  PopFuncInfo(this,L"EndEmitFunction");
  return;
}

Assistant:

void ByteCodeGenerator::EndEmitFunction(ParseNodeFnc *pnodeFnc)
{
    Assert(pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg);
    Assert(pnodeFnc->nop == knopFncDecl && currentScope->GetEnclosingScope() != nullptr || pnodeFnc->nop == knopProg);

    PopScope(); // function body

    FuncInfo *funcInfo = pnodeFnc->funcInfo;

    Scope* paramScope = funcInfo->paramScope;
    if (!funcInfo->IsBodyAndParamScopeMerged())
    {
        Assert(this->GetCurrentScope() == paramScope);
        PopScope(); // Pop the param scope
    }

    if (funcInfo->byteCodeFunction->IsFunctionParsed() && funcInfo->root->pnodeBody != nullptr)
    {
        // StartEmitFunction omits the matching PushScope for already-parsed functions.
        // TODO: Refactor Start and EndEmitFunction for clarity.
        Scope *scope = funcInfo->funcExprScope;
        if (scope && scope->GetMustInstantiate())
        {
            Assert(currentScope == scope);
            PopScope();
        }
    }

    Assert(funcInfo == this->TopFuncInfo());
    PopFuncInfo(_u("EndEmitFunction"));
}